

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Instr * __thiscall
GlobOpt::AttachBoundsCheckData
          (GlobOpt *this,Instr *instr,Opnd *lowerBound,Opnd *upperBound,int offset)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  IntConstOpnd *newDst;
  
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_00467b74;
    *puVar5 = 0;
  }
  pFVar1 = instr->m_func;
  if (lowerBound->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_00467b74;
    *puVar5 = 0;
  }
  bVar4 = lowerBound->field_0xb;
  if ((bVar4 & 2) != 0) {
    lowerBound = IR::Opnd::Copy(lowerBound,pFVar1);
    bVar4 = lowerBound->field_0xb;
  }
  lowerBound->field_0xb = bVar4 | 2;
  instr->m_src1 = lowerBound;
  if (instr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_00467b74;
    *puVar5 = 0;
  }
  pFVar1 = instr->m_func;
  if (upperBound->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_00467b74:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bVar4 = upperBound->field_0xb;
  if ((bVar4 & 2) != 0) {
    upperBound = IR::Opnd::Copy(upperBound,pFVar1);
    bVar4 = upperBound->field_0xb;
  }
  upperBound->field_0xb = bVar4 | 2;
  instr->m_src2 = upperBound;
  if (offset != 0) {
    newDst = IR::IntConstOpnd::New((long)offset,TyInt32,instr->m_func,false);
    IR::Instr::SetDst(instr,&newDst->super_Opnd);
  }
  return instr;
}

Assistant:

IR::Instr*
GlobOpt::AttachBoundsCheckData(IR::Instr* instr, IR::Opnd* lowerBound, IR::Opnd* upperBound, int offset)
{
    instr->SetSrc1(lowerBound);
    instr->SetSrc2(upperBound);
    if (offset != 0)
    {
        instr->SetDst(IR::IntConstOpnd::New(offset, TyInt32, instr->m_func));
    }
    return instr;
}